

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O3

int repl_p_lru_new(repl_p_head **head)

{
  int iVar1;
  os_mutex_t *mutex;
  ringbuf *prVar2;
  int *piVar3;
  
  mutex = (os_mutex_t *)Zalloc(0x48);
  if (mutex == (os_mutex_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = os_mutex_init(mutex);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      abort();
    }
    mutex[1].align = 0;
    *(os_mutex_t **)((long)mutex + 0x38) = mutex + 1;
    prVar2 = ringbuf_new(0x1000);
    *(ringbuf **)((long)mutex + 0x40) = prVar2;
    *head = (repl_p_head *)mutex;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
repl_p_lru_new(struct repl_p_head **head)
{
	struct repl_p_head *h = Zalloc(sizeof(struct repl_p_head));
	if (h == NULL)
		return -1;

	util_mutex_init(&h->lock);
	TAILQ_INIT(&h->first);
	h->ringbuf = ringbuf_new(LEN_RING_BUF);
	*head = h;

	return 0;
}